

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Export.cpp
# Opt level: O1

Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
exportC_abi_cxx11_(Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,Resources *res,ExportSettings *settings,Pipeline *p,
                  IAutomation *automation)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Alloc_hider _Var4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  _Rb_tree_color _Var9;
  uint uVar10;
  uint uVar11;
  Flag FVar12;
  pointer pbVar13;
  int *piVar14;
  pointer pTVar15;
  pointer pFVar16;
  pointer pCVar17;
  int *piVar18;
  size_type sVar19;
  FILE *__stream;
  undefined8 uVar20;
  undefined8 uVar21;
  Resources *pRVar22;
  FILE *__stream_00;
  const_iterator cVar23;
  const_iterator cVar24;
  FILE *pFVar25;
  pointer p_Var26;
  pointer p_Var27;
  pointer pTVar28;
  pointer pPVar29;
  char *pcVar30;
  undefined *puVar31;
  Section *it;
  long lVar32;
  pointer pFVar33;
  key_type *__k;
  int *piVar34;
  size_t __size;
  char *pcVar35;
  Command *cmd;
  ulong uVar36;
  pointer pCVar37;
  Pipeline *pPVar38;
  pointer pbVar39;
  ulong uVar40;
  shared_ptr<PolledShaderSource> shader;
  Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  shader_source;
  ExportResult automation_result;
  string vname;
  string filename;
  Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  automation_export;
  shared_ptr<PolledShaderSource> shader_1;
  UniformsMap global_uniforms;
  string local_238;
  FILE *local_218;
  undefined1 local_210 [48];
  pointer local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [32];
  bool local_1a8;
  Resources *local_1a0;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_198;
  Pipeline *local_190;
  ExportSettings *local_188;
  undefined1 local_180 [32];
  _Rb_tree_node_base local_160;
  int local_138;
  pointer local_130;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
  *local_128;
  string local_120;
  undefined1 local_100 [32];
  undefined1 local_e0 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
  _Stack_c8;
  undefined4 local_98;
  bool local_90;
  undefined1 local_88 [48];
  _Rb_tree_node_base local_58;
  undefined8 local_38;
  
  pcVar30 = (settings->c_source)._M_dataplus._M_p;
  local_1a0 = res;
  local_188 = settings;
  local_128 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
               *)automation;
  aAppDebugPrintf("Exporting rendering pipeline to \'%s\'",pcVar30);
  __stream_00 = fopen(pcVar30,"w");
  local_218 = __stream_00;
  if (__stream_00 == (FILE *)0x0) {
    format_abi_cxx11_((string *)local_180,"Cannot open file \'%s\' for writing",pcVar30);
    uVar21 = local_180._16_8_;
    uVar20 = local_180._8_8_;
    _Var4._M_p = local_e0 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_180 + 0x10)) {
      _Stack_c8._M_impl._0_8_ = local_180._24_8_;
      local_e0._0_8_ = _Var4._M_p;
    }
    else {
      local_e0._0_8_ = local_180._0_8_;
    }
    local_180._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_180._16_8_ = local_180._16_8_ & 0xffffffffffffff00;
    paVar2 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar2;
    if ((pointer)local_e0._0_8_ == _Var4._M_p) {
      paVar2->_M_allocated_capacity = uVar21;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           _Stack_c8._M_impl._0_8_;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_e0._0_8_;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = uVar21;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = uVar20;
    local_e0._8_8_ = (pointer)0x0;
    local_e0._16_8_ = uVar21 & 0xffffffffffffff00;
    __return_storage_ptr__->has_value_ = false;
    local_180._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_180 + 0x10);
    local_e0._0_8_ = _Var4._M_p;
  }
  else {
    local_58._M_left = &local_58;
    local_58._M_color = _S_red;
    local_58._M_parent = (_Base_ptr)0x0;
    local_38._0_4_ = _S_red;
    local_38._4_4_ = 0;
    pbVar39 = (p->shader_filenames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar13 = (p->shader_filenames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_198 = __return_storage_ptr__;
    local_190 = p;
    local_88._16_8_ = pcVar30;
    local_58._M_right = local_58._M_left;
    if (pbVar39 != pbVar13) {
      do {
        Resources::getShaderSource((Resources *)local_210,(string *)local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          format_abi_cxx11_((string *)local_180,"Cannot open shader \'%s\'",
                            (pbVar39->_M_dataplus)._M_p);
          uVar21 = local_180._16_8_;
          uVar20 = local_180._8_8_;
          _Var4._M_p = local_e0 + 0x10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_180 + 0x10)) {
            _Stack_c8._M_impl._0_8_ = local_180._24_8_;
            local_e0._0_8_ = _Var4._M_p;
          }
          else {
            local_e0._0_8_ = local_180._0_8_;
          }
          local_180._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_180._16_8_ = local_180._16_8_ & 0xffffffffffffff00;
          paVar2 = &(local_198->field_0).error_.error_.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&local_198->field_0 = paVar2;
          if ((pointer)local_e0._0_8_ == _Var4._M_p) {
            paVar2->_M_allocated_capacity = uVar21;
            *(undefined8 *)((long)&(local_198->field_0).error_.error_.field_2 + 8) =
                 _Stack_c8._M_impl._0_8_;
          }
          else {
            (local_198->field_0).error_.error_._M_dataplus._M_p = (pointer)local_e0._0_8_;
            (local_198->field_0).error_.error_.field_2._M_allocated_capacity = uVar21;
          }
          (local_198->field_0).error_.error_._M_string_length = uVar20;
          local_e0._8_8_ = (pointer)0x0;
          local_e0._16_8_ = uVar21 & 0xffffffffffffff00;
          local_198->has_value_ = false;
          __stream_00 = local_218;
          __return_storage_ptr__ = local_198;
          local_180._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_180 + 0x10);
          local_e0._0_8_ = _Var4._M_p;
LAB_0011085a:
          if ((pointer)local_210._8_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
          }
          goto LAB_00110a90;
        }
        aAppDebugPrintf("%s: uniforms: %d",(pbVar39->_M_dataplus)._M_p,
                        (ulong)*(uint *)(local_210._0_8_ + 200));
        ::shader::appendUniforms
                  ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_e0,(UniformsMap *)(local_88 + 0x28),
                   (UniformsMap *)(local_210._0_8_ + 0xa0));
        if ((bool)(undefined1)_Stack_c8._M_impl.super__Rb_tree_header._M_header._M_color == false) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1c8,"Error merging uniforms from vertex: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0);
          __return_storage_ptr__ = local_198;
          uVar20 = local_1c8._16_8_;
          __stream_00 = local_218;
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_180 + 0x10);
          _Var4._M_p = local_1c8 + 0x10;
          if ((pointer)local_1c8._0_8_ == _Var4._M_p) {
            local_180._24_8_ = local_1c8._24_8_;
            local_180._0_8_ = paVar2;
          }
          else {
            local_180._0_8_ = local_1c8._0_8_;
          }
          local_1c8._16_8_ = local_1c8._16_8_ & 0xffffffffffffff00;
          paVar1 = &(local_198->field_0).error_.error_.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&local_198->field_0 = paVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._0_8_ == paVar2) {
            paVar1->_M_allocated_capacity = uVar20;
            *(undefined8 *)((long)&(local_198->field_0).error_.error_.field_2 + 8) =
                 local_180._24_8_;
          }
          else {
            (local_198->field_0).error_.error_._M_dataplus._M_p = (pointer)local_180._0_8_;
            (local_198->field_0).error_.error_.field_2._M_allocated_capacity = uVar20;
          }
          (local_198->field_0).error_.error_._M_string_length = local_1c8._8_8_;
          local_180._16_8_ = uVar20 & 0xffffffffffffff00;
          local_198->has_value_ = false;
          local_180._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1c8._8_8_ = (pointer)0x0;
          local_1c8._0_8_ = _Var4._M_p;
          local_180._0_8_ = paVar2;
          if (((bool)(undefined1)_Stack_c8._M_impl.super__Rb_tree_header._M_header._M_color == false
              ) && ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10)) {
            local_180._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_1c8._8_8_ = (pointer)0x0;
            operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
          }
          goto LAB_0011085a;
        }
        if ((pointer)local_210._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
        }
        pbVar39 = pbVar39 + 1;
      } while (pbVar39 != pbVar13);
    }
    (*(*(_func_int ***)&local_128->_M_impl)[6])(local_e0,local_128,1,"C",local_88 + 0x28);
    __return_storage_ptr__ = local_198;
    __stream_00 = local_218;
    if (local_90 == false) {
      format_abi_cxx11_((string *)local_1c8,"Error exporting automation data: %s",local_e0._0_8_);
      uVar21 = local_1c8._16_8_;
      uVar20 = local_1c8._8_8_;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_180 + 0x10);
      if ((undefined1 *)local_1c8._0_8_ == local_1c8 + 0x10) {
        local_180._24_8_ = local_1c8._24_8_;
        local_180._0_8_ = paVar2;
      }
      else {
        local_180._0_8_ = local_1c8._0_8_;
      }
      local_1c8._8_8_ = (pointer)0x0;
      local_1c8._16_8_ = local_1c8._16_8_ & 0xffffffffffffff00;
      paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_0 = paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._0_8_ == paVar2) {
        paVar1->_M_allocated_capacity = uVar21;
        *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
             local_180._24_8_;
      }
      else {
        (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_180._0_8_;
        (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = uVar21;
      }
      (__return_storage_ptr__->field_0).error_.error_._M_string_length = uVar20;
      local_180._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_180._16_8_ = uVar21 & 0xffffffffffffff00;
      __return_storage_ptr__->has_value_ = false;
      local_1c8._0_8_ = local_1c8 + 0x10;
      local_180._0_8_ = paVar2;
    }
    else {
      std::vector<Section,_std::allocator<Section>_>::vector
                ((vector<Section,_std::allocator<Section>_> *)local_180,
                 (vector<Section,_std::allocator<Section>_> *)local_e0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
                  *)(local_180 + 0x18),&_Stack_c8);
      local_138 = local_98;
      p_Var26 = (pointer)(local_190->shader_filenames).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      local_88._32_8_ =
           (local_190->shader_filenames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pFVar25 = local_218;
      pPVar38 = local_190;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_180._0_8_;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_180._8_8_;
      if (p_Var26 != (pointer)local_88._32_8_) {
        local_88._24_8_ = &local_188->shader_path;
        do {
          validateName(&local_120,(string *)p_Var26);
          local_130 = p_Var26;
          Resources::getShaderSource((Resources *)local_88,(string *)local_1a0);
          uVar20 = local_88._0_8_;
          local_210._8_8_ = (pointer)0x0;
          local_210._16_8_ = local_210._16_8_ & 0xffffffffffffff00;
          local_210._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_210 + 0x10);
          if (*(int *)(local_88._0_8_ + 0x80) != 0) {
            format_abi_cxx11_(&local_238,"#version %d\n");
            std::__cxx11::string::operator=((string *)local_210,(string *)&local_238);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (0 < local_138) {
            format_abi_cxx11_(&local_238,"uniform float u[%d];\n");
            std::__cxx11::string::_M_append(local_210,(ulong)local_238._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
          }
          piVar14 = *(int **)(uVar20 + 0x90);
          if (*(int **)(uVar20 + 0x88) != piVar14) {
            local_128 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
                         *)(uVar20 + 0xa0);
            piVar18 = *(int **)(uVar20 + 0x88);
            do {
              __k = (key_type *)(piVar18 + 2);
              iVar8 = *piVar18;
              if (iVar8 == 0) {
                std::__cxx11::string::_M_append(local_210,(ulong)(__k->_M_dataplus)._M_p);
              }
              else if (iVar8 == 2) {
                cVar23 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
                         ::find(local_128,__k);
                if (cVar23._M_node == (_Base_ptr)(uVar20 + 0xa8)) {
                  format_abi_cxx11_((string *)(local_210 + 0x28),
                                    "Cannot find uniform chunk \'%s\' in uniforms",
                                    (__k->_M_dataplus)._M_p);
                  local_1c8._8_8_ = local_1e0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._40_8_ == &local_1d8) {
                    local_238.field_2._8_8_ = local_1d8._8_8_;
                    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                  }
                  else {
                    local_238._M_dataplus._M_p = (pointer)local_210._40_8_;
                  }
                  goto LAB_0010f914;
                }
                cVar24 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
                                 *)(local_180 + 0x18),__k);
                if (cVar24._M_node == &local_160) {
                  format_abi_cxx11_((string *)(local_210 + 0x28),
                                    "Cannot find uniform \'%s\' in exported uniforms",
                                    (__k->_M_dataplus)._M_p);
                  local_1c8._16_8_ = local_1d8._M_allocated_capacity;
                  local_1c8._8_8_ = local_1e0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._40_8_ == &local_1d8) {
                    local_238.field_2._8_8_ = local_1d8._8_8_;
                    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                  }
                  else {
                    local_238._M_dataplus._M_p = (pointer)local_210._40_8_;
                  }
                  local_1e0 = (pointer)0x0;
                  local_1d8._M_allocated_capacity =
                       local_1d8._M_allocated_capacity & 0xffffffffffffff00;
                  local_1c8._0_8_ = local_1c8 + 0x10;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._M_dataplus._M_p == &local_238.field_2) {
                    local_1c8._24_8_ = local_238.field_2._8_8_;
                  }
                  else {
                    local_1c8._0_8_ = local_238._M_dataplus._M_p;
                  }
                  local_238._M_string_length = 0;
                  local_238.field_2._M_allocated_capacity = local_1c8._16_8_ & 0xffffffffffffff00;
                  local_1a8 = false;
                  local_210._40_8_ = &local_1d8;
                }
                else {
                  _Var9 = cVar24._M_node[2]._M_color;
                  uVar40 = (ulong)_Var9;
                  if ((int)_Var9 < 0) {
                    if (cVar23._M_node[2]._M_color - _S_black < 4) {
                      fVar5 = *(float *)&cVar24._M_node[2].field_0x4;
                      fVar6 = *(float *)&cVar24._M_node[2]._M_parent;
                      fVar7 = *(float *)((long)&cVar24._M_node[2]._M_parent + 4);
                      switch(cVar23._M_node[2]._M_color) {
                      case _S_black:
                        format_abi_cxx11_(&local_238,"%f",SUB84((double)fVar5,0),(ulong)(uint)fVar6,
                                          (ulong)(uint)fVar7);
                        std::__cxx11::string::_M_append(local_210,(ulong)local_238._M_dataplus._M_p)
                        ;
                        break;
                      case 2:
                        format_abi_cxx11_(&local_238,"vec2(%f,%f)",SUB84((double)fVar5,0),
                                          (double)fVar6,(ulong)(uint)fVar7);
                        std::__cxx11::string::_M_append(local_210,(ulong)local_238._M_dataplus._M_p)
                        ;
                        break;
                      case 3:
                        format_abi_cxx11_(&local_238,"vec3(%f,%f,%f)",SUB84((double)fVar5,0),
                                          (double)fVar6,(double)fVar7);
                        std::__cxx11::string::_M_append(local_210,(ulong)local_238._M_dataplus._M_p)
                        ;
                        break;
                      case 4:
                        format_abi_cxx11_(&local_238,"vec4(%f,%f,%f,%f)",SUB84((double)fVar5,0),
                                          (double)fVar6,(double)fVar7,
                                          (double)*(float *)&cVar24._M_node[2]._M_left);
                        std::__cxx11::string::_M_append(local_210,(ulong)local_238._M_dataplus._M_p)
                        ;
                      }
                      goto LAB_0010f762;
                    }
                  }
                  else {
                    switch(cVar23._M_node[2]._M_color) {
                    case _S_black:
                      format_abi_cxx11_(&local_238,"u[%d]");
                      std::__cxx11::string::_M_append(local_210,(ulong)local_238._M_dataplus._M_p);
                      break;
                    case 2:
                      format_abi_cxx11_(&local_238,"vec2(u[%d],u[%d])",uVar40,
                                        (ulong)(_Var9 + _S_black));
                      std::__cxx11::string::_M_append(local_210,(ulong)local_238._M_dataplus._M_p);
                      break;
                    case 3:
                      format_abi_cxx11_(&local_238,"vec3(u[%d],u[%d],u[%d])",uVar40,
                                        (ulong)(_Var9 + _S_black),(ulong)(_Var9 + 2));
                      std::__cxx11::string::_M_append(local_210,(ulong)local_238._M_dataplus._M_p);
                      break;
                    case 4:
                      format_abi_cxx11_(&local_238,"vec4(u[%d],u[%d],u[%d],u[%d])",uVar40,
                                        (ulong)(_Var9 + _S_black),(ulong)(_Var9 + 2),
                                        (ulong)(_Var9 + 3));
                      std::__cxx11::string::_M_append(local_210,(ulong)local_238._M_dataplus._M_p);
                      break;
                    default:
                      goto switchD_0010f4c6_default;
                    }
LAB_0010f762:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238._M_dataplus._M_p != &local_238.field_2) {
                      operator_delete(local_238._M_dataplus._M_p,
                                      local_238.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
switchD_0010f4c6_default:
                if (cVar24._M_node == &local_160) goto LAB_0010f96f;
              }
              else if (iVar8 == 1) {
                local_100._0_8_ = (pointer)0x2e;
                local_210._40_8_ = &local_1d8;
                local_238._M_dataplus._M_p =
                     (pointer)std::__cxx11::string::_M_create
                                        ((ulong *)(local_210 + 0x28),(ulong)local_100);
                local_1d8._M_allocated_capacity = local_100._0_8_;
                builtin_strncpy((char *)((long)local_238._M_dataplus._M_p + 0x1e),"at shade",8);
                builtin_strncpy((char *)((long)local_238._M_dataplus._M_p + 0x26),"r source",8);
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)local_238._M_dataplus._M_p + 0x10))->_M_allocated_capacity =
                     0x64696c61766e6920;
                *(undefined8 *)((long)local_238._M_dataplus._M_p + 0x18) = 0x74616c66206e6920;
                *(undefined8 *)local_238._M_dataplus._M_p = 0x206564756c636e49;
                *(undefined8 *)((long)local_238._M_dataplus._M_p + 8) = 0x7369206b6e756863;
                local_238._M_dataplus._M_p[local_100._0_8_] = '\0';
                local_1c8._8_8_ = local_100._0_8_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p == &local_1d8) {
                  local_238.field_2._8_8_ = local_1d8._8_8_;
                  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                }
LAB_0010f914:
                local_1c8._16_8_ = local_1d8._M_allocated_capacity;
                local_210._40_8_ = &local_1d8;
                local_1c8._0_8_ = local_1c8 + 0x10;
                local_1e0 = (pointer)0x0;
                local_1d8._M_allocated_capacity =
                     local_1d8._M_allocated_capacity & 0xffffffffffffff00;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p == &local_238.field_2) {
                  local_1c8._24_8_ = local_238.field_2._8_8_;
                }
                else {
                  local_1c8._0_8_ = local_238._M_dataplus._M_p;
                }
                local_238._M_string_length = 0;
                local_238.field_2._M_allocated_capacity = local_1c8._16_8_ & 0xffffffffffffff00;
                local_1a8 = false;
                goto LAB_0010f96f;
              }
              piVar34 = piVar18 + 10;
              piVar18 = piVar18 + 10;
            } while (piVar34 != piVar14);
          }
          local_1c8._0_8_ = local_1c8 + 0x10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_210 + 0x10)) {
            local_1c8._24_8_ = local_210._24_8_;
          }
          else {
            local_1c8._0_8_ = local_210._0_8_;
          }
          local_1c8._16_8_ = local_210._16_8_;
          local_1c8._8_8_ = local_210._8_8_;
          local_210._8_8_ = (pointer)0x0;
          local_210._16_8_ = local_210._16_8_ & 0xffffffffffffff00;
          local_1a8 = true;
          local_210._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_210 + 0x10);
LAB_0010f96f:
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_210 + 0x10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._0_8_ != paVar2) {
            operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
          }
          __return_storage_ptr__ = local_198;
          paVar1 = &local_238.field_2;
          if (local_1a8 == false) {
            format_abi_cxx11_(&local_238,"Cannot preporcess shader \'%s\': %s",
                              (local_130->super_path)._M_pathname._M_dataplus._M_p,local_1c8._0_8_);
            local_210._16_8_ = local_238.field_2._M_allocated_capacity;
            sVar19 = local_238._M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p == paVar1) {
              local_210._24_8_ = local_238.field_2._8_8_;
              local_210._0_8_ = paVar2;
            }
            else {
              local_210._0_8_ = local_238._M_dataplus._M_p;
            }
            local_238._M_string_length = 0;
            local_238.field_2._M_allocated_capacity =
                 local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
            paVar3 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&__return_storage_ptr__->field_0 = paVar3;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._0_8_ == paVar2) {
              paVar3->_M_allocated_capacity = local_210._16_8_;
              *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
                   local_210._24_8_;
            }
            else {
              (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                   (pointer)local_210._0_8_;
              (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                   local_210._16_8_;
            }
            (__return_storage_ptr__->field_0).error_.error_._M_string_length = sVar19;
            local_210._8_8_ = (pointer)0x0;
            local_210._16_8_ = local_210._16_8_ & 0xffffffffffffff00;
            __return_storage_ptr__->has_value_ = false;
            local_238._M_dataplus._M_p = (pointer)paVar1;
            local_210._0_8_ = paVar2;
LAB_00110a25:
            Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected((Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_1c8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_00110a69;
          }
          if ((local_188->shader_path)._M_string_length == 0) {
            fprintf(__stream_00,"static const char %s[] =\n",local_120._M_dataplus._M_p);
            local_238.field_2._M_allocated_capacity._0_2_ = 10;
            local_238._M_string_length = 1;
            local_238._M_dataplus._M_p = (pointer)paVar1;
            if ((pointer)local_1c8._8_8_ != (pointer)0x0) {
              p_Var26 = (pointer)0x0;
              do {
                p_Var27 = (pointer)std::__cxx11::string::find
                                             (local_1c8,(ulong)local_238._M_dataplus._M_p,
                                              (ulong)p_Var26);
                if (p_Var27 == (pointer)0xffffffffffffffff) {
                  p_Var27 = (pointer)local_1c8._8_8_;
                }
                fprintf(__stream_00,"\t\"%.*s\\n\"\n",(ulong)(uint)((int)p_Var27 - (int)p_Var26),
                        (char *)((long)&(p_Var26->super_path)._M_pathname._M_dataplus._M_p +
                                local_1c8._0_8_));
                p_Var26 = (pointer)((long)&(p_Var27->super_path)._M_pathname._M_dataplus._M_p +
                                   local_238._M_string_length);
              } while (p_Var26 < (ulong)local_1c8._8_8_);
            }
            fwrite(";\n\n",3,1,__stream_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != paVar1) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            local_210[0x20] = '\x01';
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88._24_8_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_130);
            aAppDebugPrintf("shader %s -> %s",local_120._M_dataplus._M_p,local_100._0_8_);
            uVar21 = local_1c8._8_8_;
            uVar20 = local_1c8._0_8_;
            pFVar25 = fopen((char *)local_100._0_8_,"wb");
            if (pFVar25 == (FILE *)0x0) {
              format_abi_cxx11_((string *)(local_210 + 0x28),"Cannot open file \'%s\' for writing",
                                local_100._0_8_);
LAB_0010fb55:
              local_210._16_8_ = local_1d8._M_allocated_capacity;
              local_210._8_8_ = local_1e0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._40_8_ == &local_1d8) {
                local_238.field_2._8_8_ = local_1d8._8_8_;
                local_238._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_238._M_dataplus._M_p = (pointer)local_210._40_8_;
              }
              local_1e0 = (pointer)0x0;
              local_1d8._M_allocated_capacity = local_1d8._M_allocated_capacity & 0xffffffffffffff00
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p == paVar1) {
                local_210._24_8_ = local_238.field_2._8_8_;
                local_210._0_8_ = paVar2;
              }
              else {
                local_210._0_8_ = local_238._M_dataplus._M_p;
              }
              local_238._M_string_length = 0;
              local_238.field_2._M_allocated_capacity = local_210._16_8_ & 0xffffffffffffff00;
              local_210[0x20] = '\0';
              local_210._40_8_ = &local_1d8;
            }
            else {
              p_Var26 = (pointer)fwrite((void *)uVar20,1,uVar21,pFVar25);
              if (p_Var26 != (pointer)uVar21) {
                format_abi_cxx11_((string *)(local_210 + 0x28),
                                  "Cannot write %zu bytes, could write only %zu",uVar21,p_Var26);
                goto LAB_0010fb55;
              }
              local_210[0x20] = '\x01';
            }
            if (pFVar25 != (FILE *)0x0) {
              fclose(pFVar25);
            }
            if ((pointer)local_100._0_8_ != (pointer)(local_100 + 0x10)) {
              operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
            }
          }
          __return_storage_ptr__ = local_198;
          if (local_210[0x20] == '\0') {
            format_abi_cxx11_((string *)(local_210 + 0x28),"Cannot write shader \'%s\': %s",
                              local_120._M_dataplus._M_p,local_210._0_8_);
            local_238.field_2._M_allocated_capacity = local_1d8._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._40_8_ == &local_1d8) {
              local_238.field_2._8_8_ = local_1d8._8_8_;
              local_238._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_238._M_dataplus._M_p = (pointer)local_210._40_8_;
            }
            local_1d8._M_allocated_capacity = local_1d8._M_allocated_capacity & 0xffffffffffffff00;
            paVar3 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&__return_storage_ptr__->field_0 = paVar3;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p == paVar1) {
              paVar3->_M_allocated_capacity = local_238.field_2._M_allocated_capacity;
              *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
                   local_238.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                   local_238._M_dataplus._M_p;
              (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                   local_238.field_2._M_allocated_capacity;
            }
            (__return_storage_ptr__->field_0).error_.error_._M_string_length = (size_type)local_1e0;
            local_238.field_2._M_allocated_capacity =
                 local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
            __return_storage_ptr__->has_value_ = false;
            local_1e0 = (pointer)0x0;
            local_238._M_string_length = 0;
            local_238._M_dataplus._M_p = (pointer)paVar1;
            local_210._40_8_ = &local_1d8;
            if ((local_210[0x20] == '\0') &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._0_8_ != paVar2)) {
              local_1e0 = (pointer)0x0;
              local_238._M_string_length = 0;
              operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
            }
            goto LAB_00110a25;
          }
          Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1c8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          }
          p_Var26 = local_130;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          p_Var26 = (pointer)&(p_Var26->super_path)._M_cmpts;
          pFVar25 = local_218;
          pPVar38 = local_190;
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_180._0_8_;
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_180._8_8_;
        } while (p_Var26 != (pointer)local_88._32_8_);
      }
      for (; __stream_00 = pFVar25, uVar20 = local_180._8_8_, __stream = local_218,
          local_218 = __stream_00, local_190 = pPVar38,
          paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._8_8_; paVar2 = paVar2 + 6) {
        local_180._8_8_ = paVar1;
        if (*(int *)paVar2 == 0) {
          fprintf(__stream,"#pragma data_seg(\".%s\")\n",*(undefined8 *)(paVar2->_M_local_buf + 8));
          fprintf(__stream,"%.*s\n",
                  (ulong)(uint)(*(int *)(paVar2->_M_local_buf + 0x50) -
                               (int)*(undefined8 *)(paVar2->_M_local_buf + 0x48)));
        }
        pFVar25 = local_218;
        pPVar38 = local_190;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_180._8_8_;
        local_180._8_8_ = uVar20;
        local_218 = __stream;
      }
      pTVar28 = (pPVar38->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar15 = (pPVar38->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_180._8_8_ = paVar1;
      if (pTVar28 != pTVar15) {
        fprintf(__stream_00,"static GLuint textures[%d];\n",
                (ulong)(uint)((int)((ulong)((long)pTVar15 - (long)pTVar28) >> 4) * -0x55555555));
      }
      if ((pPVar38->framebuffers).
          super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pPVar38->framebuffers).
          super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        fprintf(__stream_00,"static GLuint framebuffers[%d];\n",
                (ulong)(uint)((int)((ulong)((long)(pPVar38->textures).
                                                  super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(pPVar38->textures).
                                                 super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                             -0x55555555));
      }
      fprintf(__stream_00,"static GLuint programs[%d];\n",
              (ulong)((long)(pPVar38->programs).
                            super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pPVar38->programs).
                           super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
      fwrite("\nstatic void videoInit() {\n",0x1b,1,__stream_00);
      pTVar28 = (pPVar38->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar15 = (pPVar38->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar28 != pTVar15) {
        fprintf(__stream_00,"\tglGenTextures(%d, textures);\n",
                (ulong)(uint)((int)((ulong)((long)pTVar15 - (long)pTVar28) >> 4) * -0x55555555));
      }
      pFVar33 = (pPVar38->framebuffers).
                super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar16 = (pPVar38->framebuffers).
                super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pFVar33 != pFVar16) {
        fprintf(__stream_00,"\tglGenFramebuffers(%d, framebuffers);\n",
                (ulong)(uint)((int)((ulong)((long)pFVar16 - (long)pFVar33) >> 2) * -0x33333333));
      }
      if ((pPVar38->textures).
          super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pPVar38->textures).
          super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pTVar28 = (pPVar38->textures).
                  super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pPVar38->textures).
            super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
            super__Vector_impl_data._M_finish != pTVar28) {
          lVar32 = 8;
          uVar40 = 0;
          do {
            uVar36 = (ulong)*(uint *)((long)&pTVar28->w + lVar32);
            pcVar30 = "";
            pcVar35 = "";
            if (uVar36 < 3) {
              pcVar30 = &DAT_001bb6cc + *(int *)(&DAT_001bb6cc + uVar36 * 4);
              pcVar35 = &DAT_001bb6d8 + *(int *)(&DAT_001bb6d8 + uVar36 * 4);
            }
            fprintf(local_218,"\ttextureInit(textures[%d], %d, %d, %s, %s);\n",uVar40 & 0xffffffff,
                    (ulong)*(uint *)((long)pTVar28 + lVar32 + -8),
                    (ulong)*(uint *)((long)pTVar28 + lVar32 + -4),pcVar35,pcVar30);
            uVar40 = uVar40 + 1;
            pTVar28 = (local_190->textures).
                      super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            lVar32 = lVar32 + 0x30;
          } while (uVar40 < (ulong)(((long)(local_190->textures).
                                           super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pTVar28 >> 4) * -0x5555555555555555));
        }
        __stream_00 = local_218;
        fputc(10,local_218);
        pPVar38 = local_190;
      }
      pFVar25 = local_218;
      if ((pPVar38->framebuffers).
          super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pPVar38->framebuffers).
          super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pFVar33 = (pPVar38->framebuffers).
                  super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((pPVar38->framebuffers).
            super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
            _M_impl.super__Vector_impl_data._M_finish != pFVar33) {
          local_1a0 = (Resources *)0x4;
          uVar40 = 0;
          do {
            fprintf(pFVar25,"\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d]);\n",
                    uVar40 & 0xffffffff);
            pRVar22 = local_1a0;
            if (0 < pFVar33[uVar40].textures_count) {
              uVar36 = 0;
              do {
                fprintf(pFVar25,
                        "\tglFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + %d, GL_TEXTURE_2D, textures[%d], 0);\n"
                        ,uVar36 & 0xffffffff,
                        (ulong)*(uint *)((long)pFVar33->textures + (long)pRVar22 + uVar36 * 4 + -4))
                ;
                uVar36 = uVar36 + 1;
              } while ((long)uVar36 < (long)pFVar33[uVar40].textures_count);
            }
            uVar40 = uVar40 + 1;
            pFVar33 = (local_190->framebuffers).
                      super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_1a0 = (Resources *)
                        ((local_1a0->project_root_)._M_pathname.field_2._M_local_buf + 4);
          } while (uVar40 < (ulong)(((long)(local_190->framebuffers).
                                           super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pFVar33 >> 2) * -0x3333333333333333));
        }
        __stream_00 = local_218;
        fputc(10,local_218);
        pPVar38 = local_190;
      }
      pPVar29 = (pPVar38->programs).
                super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pPVar38->programs).
          super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
          super__Vector_impl_data._M_finish != pPVar29) {
        uVar40 = 0;
        do {
          validateName((string *)local_1c8,
                       (pPVar38->shader_filenames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + pPVar29[uVar40].vertex);
          uVar20 = local_1c8._0_8_;
          validateName((string *)local_210,
                       (pPVar38->shader_filenames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (pPVar38->programs).
                       super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar40].fragment);
          fprintf(__stream_00,"\tprograms[%d] = programInit(%s, %s);\n",uVar40 & 0xffffffff,uVar20,
                  local_210._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_210 + 0x10)) {
            operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
          }
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
          }
          uVar40 = uVar40 + 1;
          pPVar29 = (local_190->programs).
                    super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pPVar38 = local_190;
        } while (uVar40 < (ulong)((long)(local_190->programs).
                                        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar29
                                 >> 3));
      }
      fwrite("}\n\n",3,1,__stream_00);
      fwrite("static const GLuint draw_buffers[] = {GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1, GL_COLOR_ATTACHMENT2, GL_COLOR_ATTACHMENT3};\n\n"
             ,0x80,1,__stream_00);
      fwrite("static void videoPaint(float t) {\n",0x22,1,__stream_00);
      fwrite("\tint current_program;\n\tstatic unsigned int frame_seq = 0;\n\t++frame_seq;\n\tconst int ping = (int)(frame_seq&1), pong = (int)((frame_seq+1)&1);\n"
             ,0x8d,1,__stream_00);
      pCVar37 = (pPVar38->commands).
                super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pCVar17 = (pPVar38->commands).
                super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      __return_storage_ptr__ = local_198;
      if (pCVar37 != pCVar17) {
        local_1a0 = (Resources *)0x0;
        do {
          pPVar38 = local_190;
          pRVar22 = local_1a0;
          switch(pCVar37->op) {
          case BindFramebuffer:
            lVar32 = (long)(pCVar37->bindFramebuffer).framebuffer.index;
            if (lVar32 == -1) {
              fwrite("\tglBindFramebuffer(GL_FRAMEBUFFER, 0);\n",0x27,1,__stream_00);
              uVar10 = local_188->width;
              uVar11 = local_188->height;
            }
            else {
              pFVar33 = (local_190->framebuffers).
                        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              fprintf(local_218,"\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d%s]);\n",lVar32,
                      *(undefined8 *)
                       (&DAT_001fc0a0 + (ulong)(pCVar37->bindFramebuffer).framebuffer.pingpong * 8))
              ;
              fprintf(local_218,"\tglDrawBuffers(%d, draw_buffers);\n",
                      (ulong)(uint)pFVar33[lVar32].textures_count);
              iVar8 = pFVar33[lVar32].textures[0];
              pTVar28 = (pPVar38->textures).
                        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar10 = pTVar28[iVar8].w;
              uVar11 = pTVar28[iVar8].h;
              __stream_00 = local_218;
              __return_storage_ptr__ = local_198;
            }
            fprintf(__stream_00,"\tglViewport(0, 0, %d, %d);\n",(ulong)uVar10,(ulong)uVar11);
            break;
          case UseProgram:
            local_1a0 = (Resources *)0x0;
            fprintf(__stream_00,"\tcurrent_program = programs[%d];\n",
                    (ulong)(uint)(pCVar37->useProgram).program.index);
            fwrite("\tglUseProgram(current_program);\n",0x20,1,__stream_00);
            fwrite("\tglUniform1fv(glGetUniformLocation(current_program, \"u\"), AUTOMATION_SIZE, uniforms);\n"
                   ,0x56,1,__stream_00);
            fprintf(__stream_00,
                    "\tglUniform2f(glGetUniformLocation(current_program, \"R\"), %d, %d);\n",
                    (ulong)(uint)local_188->width,(ulong)(uint)local_188->height);
            __size = 0x3d;
            pcVar30 = "\tglUniform1f(glGetUniformLocation(current_program, \"t\"), t);\n";
            goto LAB_001103d8;
          case BindTexture:
            iVar8 = (int)local_1a0;
            fprintf(local_218,"\tglActiveTexture(GL_TEXTURE0 + %d);\n",(ulong)local_1a0 & 0xffffffff
                   );
            fprintf(local_218,"\tglBindTexture(GL_TEXTURE_2D, textures[%d%s]);\n",
                    (ulong)(uint)(pCVar37->bindTexture).texture.index,
                    *(undefined8 *)
                     (&DAT_001fc0a0 + (ulong)(pCVar37->bindTexture).texture.pingpong * 8));
            fprintf(local_218,"\tglUniform1i(glGetUniformLocation(current_program, \"%s\"), %d);\n",
                    (pCVar37->bindTexture).name._M_dataplus._M_p,(ulong)pRVar22 & 0xffffffff);
            local_1a0 = (Resources *)(ulong)(iVar8 + 1);
            __stream_00 = local_218;
            break;
          case DrawFullscreen:
            __size = 0x15;
            pcVar30 = "\tglRects(-1,-1,1,1);\n";
            goto LAB_001103d8;
          case Clear:
            fprintf(__stream_00,"\tglClearColor(%f, %f, %f, %f);\n",
                    SUB84((double)(pCVar37->clear).r,0),(double)(pCVar37->clear).g,
                    (double)(pCVar37->clear).b,(double)(pCVar37->clear).a);
            pcVar30 = "";
            if ((pCVar37->clear).depth != false) {
              pcVar30 = " | GL_DEPTH_BUFFER_BIT";
            }
            fprintf(__stream_00,"\tglClear(GL_COLOR_BUFFER_BIT%s);\n",pcVar30);
            break;
          case Enable:
            FVar12 = (pCVar37->enable).flag;
            if (FVar12 == VertexProgramPointSize) {
              __size = 0x29;
              pcVar30 = "\tglEnable(GL_VERTEX_PROGRAM_POINT_SIZE);\n";
            }
            else {
              if (FVar12 != DepthTest) break;
              __size = 0x1a;
              pcVar30 = "\tglEnable(GL_DEPTH_TEST);\n";
            }
            goto LAB_001103d8;
          case Disable:
            FVar12 = (pCVar37->disable).flag;
            if (FVar12 == VertexProgramPointSize) {
              __size = 0x2a;
              pcVar30 = "\tglDisable(GL_VERTEX_PROGRAM_POINT_SIZE);\n";
            }
            else {
              if (FVar12 != DepthTest) break;
              __size = 0x1b;
              pcVar30 = "\tglDisable(GL_DEPTH_TEST);\n";
            }
LAB_001103d8:
            fwrite(pcVar30,__size,1,__stream_00);
            break;
          case DrawArrays:
            uVar40 = (ulong)(pCVar37->drawArrays).mode;
            if (uVar40 < 7) {
              puVar31 = &DAT_001bb6e4 + *(int *)(&DAT_001bb6e4 + uVar40 * 4);
            }
            else {
              puVar31 = (undefined *)0x0;
            }
            fprintf(__stream_00,"\tglDrawArrays(%s, %d, %d);\n",puVar31,
                    (ulong)(uint)(pCVar37->drawArrays).start,
                    (ulong)(uint)(pCVar37->drawArrays).count);
          }
          pCVar37 = pCVar37 + 1;
        } while (pCVar37 != pCVar17);
      }
      fwrite("}\n",2,1,__stream_00);
      aAppDebugPrintf("Done exporting rendering pipeline to \'%s\'",local_88._16_8_);
      __return_storage_ptr__->has_value_ = true;
LAB_00110a69:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
                   *)(local_180 + 0x18));
      std::vector<Section,_std::allocator<Section>_>::~vector
                ((vector<Section,_std::allocator<Section>_> *)local_180);
    }
    Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_e0);
LAB_00110a90:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
                 *)(local_88 + 0x28));
  }
  if (__stream_00 != (FILE *)0x0) {
    fclose(__stream_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<void, std::string> exportC(Resources &res, const ExportSettings &settings, const renderdesc::Pipeline &p, const IAutomation &automation) {
	const char * const filename = settings.c_source.c_str();
	MSG("Exporting rendering pipeline to '%s'", filename);

	const auto f = std::unique_ptr<FILE, decltype(&fclose)>(fopen(filename, "w"), &fclose);
	if (!f)
		return Unexpected(format("Cannot open file '%s' for writing", filename));

	// Extract all uniforms from all shaders
	shader::UniformsMap global_uniforms;
	for (const auto &s: p.shader_filenames) {
		const auto shader = res.getShaderSource(s);
		if (!shader)
			return Unexpected(format("Cannot open shader '%s'", s.c_str()));

		// if (!shader->poll(1))
		// 	return Unexpected(format("Cannot read shader '%s'", s.c_str()));

		MSG("%s: uniforms: %d", s.c_str(), (int)shader->flatSource().uniforms().size());
		const auto result = shader::appendUniforms(global_uniforms, shader->flatSource().uniforms());
		if (!result)
			return Unexpected("Error merging uniforms from vertex: " + result.error());
	}

	// Export automation for all known uniforms
	auto automation_export = automation.writeExport("C", global_uniforms);
	if (!automation_export)
		return Unexpected(format("Error exporting automation data: %s", automation_export.error().c_str()));

	const IAutomation::ExportResult automation_result(std::move(automation_export.value()));

	// write shader sources given automation export
	for (const auto &s: p.shader_filenames) {
		const std::string vname = validateName(s);
		const auto shader = res.getShaderSource(s);

		auto shader_source = shaderPreprocessor(shader->flatSource(), automation_result);
		if (!shader_source)
			return Unexpected(format("Cannot preporcess shader '%s': %s", s.c_str(), shader_source.error().c_str()));

		if (auto result = writeShaderSource(f.get(), s, vname, shader_source.value(), settings)) {}
		else
			return Unexpected(format("Cannot write shader '%s': %s", vname.c_str(), result.error().c_str()));
	}

	// Write global data
	for (const auto &it: automation_result.sections) {
		if (it.type == Section::Type::Data) {
			fprintf(f.get(), "#pragma data_seg(\".%s\")\n", it.name.c_str());
			fprintf(f.get(), "%.*s\n", static_cast<int>(it.data.size()), it.data.data());
		}
	}

	if (!p.textures.empty())
		fprintf(f.get(), "static GLuint textures[%d];\n", (int)p.textures.size());

	if (!p.framebuffers.empty())
		fprintf(f.get(), "static GLuint framebuffers[%d];\n", (int)p.textures.size());

	fprintf(f.get(), "static GLuint programs[%d];\n", (int)p.programs.size());

	fprintf(f.get(), "\nstatic void videoInit() {\n");

	if (!p.textures.empty())
		fprintf(f.get(), "\tglGenTextures(%d, textures);\n", (int)p.textures.size());

	if (!p.framebuffers.empty())
		fprintf(f.get(), "\tglGenFramebuffers(%d, framebuffers);\n", (int)p.framebuffers.size());

	if (!p.textures.empty()) {
		for (size_t i = 0; i < p.textures.size(); ++i) {
			const renderdesc::Texture &t = p.textures[i];
			const char *comp = "", *type = "";

			switch (t.pixel_type) {
				case RGBA8:
					comp = "GL_RGBA";
					type = "GL_UNSIGNED_BYTE";
					break;
#ifndef ATTO_PLATFORM_RPI
				case RGBA16F:
					comp = "GL_RGBA16F";
					type = "GL_FLOAT";
					break;
				case RGBA32F:
					comp = "GL_RGBA32F";
					type = "GL_FLOAT";
					break;
#endif
			}

			fprintf(f.get(), "\ttextureInit(textures[%d], %d, %d, %s, %s);\n",
				(int)i, t.w, t.h, comp, type);
		}

		fprintf(f.get(), "\n");
	}

	if (!p.framebuffers.empty()) {
		for (size_t i = 0; i < p.framebuffers.size(); ++i) {
			const renderdesc::Framebuffer &fb = p.framebuffers[i];
			fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d]);\n", (int)i);
			for (int ti = 0; ti < fb.textures_count; ++ti) {
				fprintf(f.get(), "\tglFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + %d, "
					"GL_TEXTURE_2D, textures[%d], 0);\n", ti, fb.textures[ti]);
			}
		}

		fprintf(f.get(), "\n");
	}

	for (size_t i = 0; i < p.programs.size(); ++i) {
		fprintf(f.get(), "\tprograms[%d] = programInit(%s, %s);\n", (int)i,
			validateName(p.shader_filenames[p.programs[i].vertex]).c_str(),
			validateName(p.shader_filenames[p.programs[i].fragment]).c_str());
	}

	fprintf(f.get(), "}\n\n");

	// TODO actual count
	fprintf(f.get(), "static const GLuint draw_buffers[] = {GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1, GL_COLOR_ATTACHMENT2, GL_COLOR_ATTACHMENT3};\n\n");

	fprintf(f.get(), "static void videoPaint(float t) {\n");

	const char *pingpong[3] = {"", "+ping", "+pong"};
	fprintf(f.get(),
		"\tint current_program;\n"
		"\tstatic unsigned int frame_seq = 0;\n"
		"\t++frame_seq;\n"
		"\tconst int ping = (int)(frame_seq&1), pong = (int)((frame_seq+1)&1);\n");

	int first_texture_slot = 0;
	for (const auto &cmd: p.commands) {
		switch (cmd.op) {
			case renderdesc::Command::Op::BindFramebuffer:
				{
					const renderdesc::Command::BindFramebuffer &cmdfb = cmd.bindFramebuffer;
					if (cmdfb.framebuffer.index == -1) {
						fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, 0);\n");
						fprintf(f.get(), "\tglViewport(0, 0, %d, %d);\n", settings.width, settings.height);
					} else {
						const renderdesc::Framebuffer &fb = p.framebuffers[cmdfb.framebuffer.index];
						fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d%s]);\n",
							cmdfb.framebuffer.index, pingpong[cmdfb.framebuffer.pingpong]);
						fprintf(f.get(), "\tglDrawBuffers(%d, draw_buffers);\n", fb.textures_count);
						fprintf(f.get(), "\tglViewport(0, 0, %d, %d);\n",
							p.textures[fb.textures[0]].w,
							p.textures[fb.textures[0]].h);
					}
					break;
				}

			case renderdesc::Command::Op::UseProgram:
				{
					const renderdesc::Command::UseProgram &cmdp = cmd.useProgram;
					const int pi = cmdp.program.index;
					fprintf(f.get(), "\tcurrent_program = programs[%d];\n", pi);
					fprintf(f.get(), "\tglUseProgram(current_program);\n");
					fprintf(f.get(), "\tglUniform1fv(glGetUniformLocation(current_program, \"u\"), AUTOMATION_SIZE, uniforms);\n");
					fprintf(f.get(), "\tglUniform2f(glGetUniformLocation(current_program, \"R\"), %d, %d);\n", settings.width, settings.height);
					fprintf(f.get(), "\tglUniform1f(glGetUniformLocation(current_program, \"t\"), t);\n");

					// FIXME load automated uniforms

					first_texture_slot = 0;
					break;
				}

			case renderdesc::Command::Op::BindTexture:
				{
					const auto &cmdtex = cmd.bindTexture;
					const int slot = first_texture_slot++;
					fprintf(f.get(), "\tglActiveTexture(GL_TEXTURE0 + %d);\n", slot);
					fprintf(f.get(), "\tglBindTexture(GL_TEXTURE_2D, textures[%d%s]);\n", cmdtex.texture.index, pingpong[cmdtex.texture.pingpong]);
					fprintf(f.get(), "\tglUniform1i(glGetUniformLocation(current_program, \"%s\"), %d);\n", cmdtex.name.c_str(), slot);
					break;
				}

			case renderdesc::Command::Op::Clear:
				{
					const auto &cmdc = cmd.clear;
					fprintf(f.get(), "\tglClearColor(%f, %f, %f, %f);\n", cmdc.r, cmdc.g, cmdc.b, cmdc.a);
					fprintf(f.get(), "\tglClear(GL_COLOR_BUFFER_BIT%s);\n", cmdc.depth?" | GL_DEPTH_BUFFER_BIT":"");
					break;
				}

			case renderdesc::Command::Op::Enable:
				switch (cmd.enable.flag) {
					case renderdesc::Command::Flag::DepthTest:
						fprintf(f.get(), "\tglEnable(GL_DEPTH_TEST);\n");
						break;
#ifndef ATTO_PLATFORM_RPI
					case renderdesc::Command::Flag::VertexProgramPointSize:
						fprintf(f.get(), "\tglEnable(GL_VERTEX_PROGRAM_POINT_SIZE);\n");
						break;
#endif
				}
				break;
			case renderdesc::Command::Op::Disable:
				switch (cmd.disable.flag) {
					case renderdesc::Command::Flag::DepthTest:
						fprintf(f.get(), "\tglDisable(GL_DEPTH_TEST);\n");
						break;
#ifndef ATTO_PLATFORM_RPI
					case renderdesc::Command::Flag::VertexProgramPointSize:
						fprintf(f.get(), "\tglDisable(GL_VERTEX_PROGRAM_POINT_SIZE);\n");
						break;
#endif
				}
				break;
			case renderdesc::Command::Op::DrawArrays:
				{
					const char *mode = nullptr;
					switch (cmd.drawArrays.mode) {
						case renderdesc::Command::DrawArrays::Mode::Lines: mode = "GL_LINES"; break;
						case renderdesc::Command::DrawArrays::Mode::LineStrip: mode = "GL_LINE_STRIP"; break;
						case renderdesc::Command::DrawArrays::Mode::LineLoop: mode = "GL_LINE_LOOP"; break;
						case renderdesc::Command::DrawArrays::Mode::Points: mode = "GL_POINTS"; break;
						case renderdesc::Command::DrawArrays::Mode::Triangles: mode = "GL_TRIANGLES"; break;
						case renderdesc::Command::DrawArrays::Mode::TriangleStrip: mode = "GL_TRIANGLE_STRIP"; break;
						case renderdesc::Command::DrawArrays::Mode::TriangleFan: mode = "GL_TRIANGLE_FAN"; break;
					}
					fprintf(f.get(), "\tglDrawArrays(%s, %d, %d);\n", mode, cmd.drawArrays.start, cmd.drawArrays.count);
				}
				break;
			case renderdesc::Command::Op::DrawFullscreen:
				fprintf(f.get(), "\tglRects(-1,-1,1,1);\n");
				break;
		}
	}

	fprintf(f.get(), "}\n");
	MSG("Done exporting rendering pipeline to '%s'", filename);

	return Expected<void, std::string>();
}